

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_estimateDStreamSize_fromFrame(void *src,size_t srcSize)

{
  uint uVar1;
  size_t err;
  ZSTD_frameHeader zfh;
  U32 windowSizeMax;
  size_t srcSize_local;
  void *src_local;
  
  zfh._44_4_ = 0x80000000;
  src_local = (void *)ZSTD_getFrameHeader((ZSTD_frameHeader *)&err,src,srcSize);
  uVar1 = ERR_isError((size_t)src_local);
  if (uVar1 == 0) {
    if (src_local == (void *)0x0) {
      if (zfh.frameContentSize < 0x80000001) {
        src_local = (void *)ZSTD_estimateDStreamSize(zfh.frameContentSize);
      }
      else {
        src_local = (void *)0xfffffffffffffff0;
      }
    }
    else {
      src_local = (void *)0xffffffffffffffb8;
    }
  }
  return (size_t)src_local;
}

Assistant:

size_t ZSTD_estimateDStreamSize_fromFrame(const void* src, size_t srcSize)
{
    U32 const windowSizeMax = 1U << ZSTD_WINDOWLOG_MAX;   /* note : should be user-selectable, but requires an additional parameter (or a dctx) */
    ZSTD_frameHeader zfh;
    size_t const err = ZSTD_getFrameHeader(&zfh, src, srcSize);
    if (ZSTD_isError(err)) return err;
    RETURN_ERROR_IF(err>0, srcSize_wrong, "");
    RETURN_ERROR_IF(zfh.windowSize > windowSizeMax,
                    frameParameter_windowTooLarge, "");
    return ZSTD_estimateDStreamSize((size_t)zfh.windowSize);
}